

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_interpolation_with_magic_number.h
# Opt level: O1

void __thiscall
sptk::InputSourceInterpolationWithMagicNumber::~InputSourceInterpolationWithMagicNumber
          (InputSourceInterpolationWithMagicNumber *this)

{
  pointer pdVar1;
  
  (this->super_InputSourceInterface)._vptr_InputSourceInterface =
       (_func_int **)&PTR__InputSourceInterpolationWithMagicNumber_00110ca8;
  pdVar1 = (this->increment_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pdVar1 = (this->next_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pdVar1 = (this->curr_data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

~InputSourceInterpolationWithMagicNumber() override {
  }